

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmSourceFileSetName2(void *arg,char *name,char *dir,char *ext,int headerFileOnly)

{
  size_t sVar1;
  string local_b0;
  undefined1 local_90 [8];
  string fname;
  allocator local_59;
  string local_58;
  void *local_38;
  cmCPluginAPISourceFile *sf;
  char *pcStack_28;
  int headerFileOnly_local;
  char *ext_local;
  char *dir_local;
  char *name_local;
  void *arg_local;
  
  if (*arg == 0) {
    local_38 = arg;
    sf._4_4_ = headerFileOnly;
    pcStack_28 = ext;
    ext_local = dir;
    dir_local = name;
    name_local = (char *)arg;
    if (headerFileOnly != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_58,"HEADER_FILE_ONLY",&local_59);
      cmPropertyMap::SetProperty((cmPropertyMap *)((long)arg + 0x80),&local_58,"1");
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    std::__cxx11::string::operator=((string *)((long)local_38 + 8),dir_local);
    std::__cxx11::string::string((string *)local_90,(string *)((long)local_38 + 8));
    if ((pcStack_28 != (char *)0x0) && (sVar1 = strlen(pcStack_28), sVar1 != 0)) {
      std::__cxx11::string::operator+=((string *)local_90,".");
      std::__cxx11::string::operator+=((string *)local_90,pcStack_28);
    }
    cmsys::SystemTools::CollapseFullPath(&local_b0,(string *)local_90,ext_local);
    std::__cxx11::string::operator=((string *)((long)local_38 + 0x48),(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)local_38 + 0x48));
    std::__cxx11::string::operator=((string *)((long)local_38 + 0x28),pcStack_28);
    std::__cxx11::string::~string((string *)local_90);
  }
  return;
}

Assistant:

void CCONV cmSourceFileSetName2(void* arg, const char* name, const char* dir,
                                const char* ext, int headerFileOnly)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (sf->RealSourceFile) {
    // SetName is allowed only on temporary source files created by
    // the command for building and passing to AddSource.
    return;
  }

  // Implement the old SetName method code here.
  if (headerFileOnly) {
    sf->Properties.SetProperty("HEADER_FILE_ONLY", "1");
  }
  sf->SourceName = name;
  std::string fname = sf->SourceName;
  if (ext && strlen(ext)) {
    fname += ".";
    fname += ext;
  }
  sf->FullPath = cmSystemTools::CollapseFullPath(fname, dir);
  cmSystemTools::ConvertToUnixSlashes(sf->FullPath);
  sf->SourceExtension = ext;
}